

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

void __thiscall
expression_tree::detail::
default_branch<int,_expression_tree::no_caching,_expression_tree::sequential>::default_branch
          (default_branch<int,_expression_tree::no_caching,_expression_tree::sequential> *this,
          default_branch_t *other)

{
  default_branch_t *other_local;
  default_branch<int,_expression_tree::no_caching,_expression_tree::sequential> *this_local;
  
  node_impl<int>::node_impl(&this->super_node_impl<int>);
  (this->super_node_impl<int>)._vptr_node_impl = (_func_int **)&PTR__default_branch_002bc808;
  node<int,_expression_tree::no_caching,_expression_tree::sequential>::node(&this->l,&other->l);
  node<int,_expression_tree::no_caching,_expression_tree::sequential>::node(&this->r,&other->r);
  std::function<int_(const_int_&,_const_int_&)>::function(&this->f,&other->f);
  this->constant_ = other->constant_;
  return;
}

Assistant:

default_branch(const default_branch_t& other) : l(other.l), r(other.r) , f(other.f), constant_(other.constant_) {}